

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

cubeb_channel_layout pulse_default_layout_for_channels(uint32_t ch)

{
  if (ch - 1 < 8) {
    return *(cubeb_channel_layout *)
            ("void rename_success(pa_stream *, int, void *)" + (long)(int)ch * 4 + 0x2a);
  }
  __assert_fail("ch > 0 && ch <= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                ,0x342,"cubeb_channel_layout pulse_default_layout_for_channels(uint32_t)");
}

Assistant:

static cubeb_channel_layout
pulse_default_layout_for_channels(uint32_t ch)
{
  assert(ch > 0 && ch <= 8);
  switch (ch) {
  case 1:
    return CUBEB_LAYOUT_MONO;
  case 2:
    return CUBEB_LAYOUT_STEREO;
  case 3:
    return CUBEB_LAYOUT_3F;
  case 4:
    return CUBEB_LAYOUT_QUAD;
  case 5:
    return CUBEB_LAYOUT_3F2;
  case 6:
    return CUBEB_LAYOUT_3F_LFE | CHANNEL_SIDE_LEFT | CHANNEL_SIDE_RIGHT;
  case 7:
    return CUBEB_LAYOUT_3F3R_LFE;
  case 8:
    return CUBEB_LAYOUT_3F4_LFE;
  }
  // Never get here!
  return CUBEB_LAYOUT_UNDEFINED;
}